

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O3

REF_STATUS ref_adapt_swap(REF_GRID ref_grid)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  
  uVar1 = ref_cavity_pass(ref_grid);
  if (uVar1 == 0) {
    if ((ref_grid->surf != 0) || (ref_grid->twod != 0)) {
      iVar3 = 3;
      do {
        uVar1 = ref_swap_tri_pass(ref_grid);
        if (uVar1 != 0) {
          pcVar4 = "swap pass";
          uVar2 = 0x261;
          goto LAB_001b579e;
        }
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    uVar1 = 0;
  }
  else {
    pcVar4 = "cavity pass";
    uVar2 = 0x25e;
LAB_001b579e:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",uVar2,
           "ref_adapt_swap",(ulong)uVar1,pcVar4);
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_adapt_swap(REF_GRID ref_grid) {
  REF_INT pass;
  RSS(ref_cavity_pass(ref_grid), "cavity pass");
  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    for (pass = 0; pass < 3; pass++) {
      RSS(ref_swap_tri_pass(ref_grid), "swap pass");
    }
  }
  return REF_SUCCESS;
}